

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O1

unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
 __thiscall anon_unknown.dwarf_57b9211::OriginPubkeyProvider::Clone(OriginPubkeyProvider *this)

{
  undefined1 uVar1;
  undefined4 uVar2;
  _func_int *p_Var3;
  _func_int **pp_Var4;
  long in_RSI;
  pointer __p;
  long in_FS_OFFSET;
  _func_int *local_60;
  _Head_base<0UL,_(anonymous_namespace)::OriginPubkeyProvider_*,_false> local_58;
  undefined4 local_50;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  (**(code **)(**(long **)(in_RSI + 0x30) + 0x58))(&local_60);
  pp_Var4 = (_func_int **)operator_new(0x40);
  uVar2 = *(undefined4 *)(in_RSI + 8);
  local_50 = *(undefined4 *)(in_RSI + 0x10);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_48,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RSI + 0x18));
  p_Var3 = local_60;
  local_60 = (_func_int *)0x0;
  uVar1 = *(undefined1 *)(in_RSI + 0x38);
  *(undefined4 *)(pp_Var4 + 1) = uVar2;
  *pp_Var4 = (_func_int *)&PTR__OriginPubkeyProvider_013e3e78;
  *(undefined4 *)(pp_Var4 + 2) = local_50;
  pp_Var4[3] = (_func_int *)
               local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
  pp_Var4[4] = (_func_int *)
               local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish;
  pp_Var4[5] = (_func_int *)
               local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
  local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pp_Var4[6] = p_Var3;
  *(undefined1 *)(pp_Var4 + 7) = uVar1;
  local_58._M_head_impl = (OriginPubkeyProvider *)0x0;
  (this->super_PubkeyProvider)._vptr_PubkeyProvider = pp_Var4;
  std::
  unique_ptr<(anonymous_namespace)::OriginPubkeyProvider,_std::default_delete<(anonymous_namespace)::OriginPubkeyProvider>_>
  ::~unique_ptr((unique_ptr<(anonymous_namespace)::OriginPubkeyProvider,_std::default_delete<(anonymous_namespace)::OriginPubkeyProvider>_>
                 *)&local_58);
  if (local_60 != (_func_int *)0x0) {
    (**(code **)(*(long *)local_60 + 8))();
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return (__uniq_ptr_data<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>,_true,_true>
            )(__uniq_ptr_data<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>,_true,_true>
              )this;
  }
  __stack_chk_fail();
}

Assistant:

std::unique_ptr<PubkeyProvider> Clone() const override
    {
        return std::make_unique<OriginPubkeyProvider>(m_expr_index, m_origin, m_provider->Clone(), m_apostrophe);
    }